

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O0

void __thiscall dlib::thread_pool_implementation::thread(thread_pool_implementation *this)

{
  safe_bool sVar1;
  task_state_type *ptVar2;
  task_state_type *ptVar3;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *__stat_loc;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_RDI;
  bool bVar4;
  auto_mutex M_2;
  exception_ptr eptr;
  auto_mutex M_1;
  long idx;
  task_state_type task;
  thread_id_type id;
  auto_mutex M;
  task_state_type *in_stack_fffffffffffffd38;
  task_state_type *in_stack_fffffffffffffd40;
  thread_pool_implementation *in_stack_fffffffffffffd48;
  task_state_type *in_stack_fffffffffffffd60;
  bound_function_pointer *in_stack_fffffffffffffde0;
  unsigned_long *in_stack_fffffffffffffde8;
  array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *in_stack_fffffffffffffdf0;
  exception_ptr local_208;
  int local_1fc;
  size_t local_1e0;
  thread_id_type local_28;
  
  auto_mutex::auto_mutex((auto_mutex *)in_stack_fffffffffffffd40,(mutex *)in_stack_fffffffffffffd38)
  ;
  local_28 = get_thread_id();
  array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_>::push_back
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  auto_mutex::~auto_mutex((auto_mutex *)0x29ce37);
  task_state_type::task_state_type(in_stack_fffffffffffffd60);
  while (((ulong)in_RDI[4].pos & 1) == 0) {
    local_1e0 = 0;
    __stat_loc = in_RDI + 2;
    auto_mutex::auto_mutex
              ((auto_mutex *)in_stack_fffffffffffffd40,(mutex *)in_stack_fffffffffffffd38);
    while( true ) {
      local_1e0 = find_ready_task(in_stack_fffffffffffffd48);
      bVar4 = false;
      if (local_1e0 == 0xffffffffffffffff) {
        bVar4 = ((ulong)in_RDI[4].pos & 1) == 0;
      }
      if (!bVar4) break;
      signaler::wait((signaler *)&in_RDI[3].pos,__stat_loc);
    }
    if (((ulong)in_RDI[4].pos & 1) == 0) {
      ptVar2 = array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
               ::operator[](in_RDI,local_1e0);
      ptVar2->is_being_processed = true;
      array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
      ::operator[](in_RDI,local_1e0);
      task_state_type::operator=(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
      local_1fc = 0;
    }
    else {
      local_1fc = 3;
    }
    auto_mutex::~auto_mutex((auto_mutex *)0x29cff3);
    if (local_1fc != 0) break;
    std::__exception_ptr::exception_ptr::exception_ptr(&local_208,(nullptr_t)0x0);
    sVar1 = bound_function_pointer::operator_cast_to_function_pointer
                      ((bound_function_pointer *)0x29d023);
    if (sVar1 == 0) {
      in_stack_fffffffffffffd48 =
           (thread_pool_implementation *)
           mfp_kernel_1_base_class::operator_cast_to_function_pointer
                     ((mfp_kernel_1_base_class<0UL> *)0x29d28c);
      if (in_stack_fffffffffffffd48 == (thread_pool_implementation *)0x0) {
        in_stack_fffffffffffffd40 =
             (task_state_type *)
             mfp_kernel_1_base_class::operator_cast_to_function_pointer
                       ((mfp_kernel_1_base_class<1UL> *)0x29d2bc);
        if (in_stack_fffffffffffffd40 == (task_state_type *)0x0) {
          in_stack_fffffffffffffd38 =
               (task_state_type *)
               mfp_kernel_1_base_class::operator_cast_to_function_pointer
                         ((mfp_kernel_1_base_class<2UL> *)0x29d2f4);
          if (in_stack_fffffffffffffd38 != (task_state_type *)0x0) {
            member_function_pointer<long,_long,_void,_void>::operator()
                      ((member_function_pointer<long,_long,_void,_void> *)in_stack_fffffffffffffd40,
                       (long)in_stack_fffffffffffffd38,0x29d321);
          }
        }
        else {
          member_function_pointer<long,_void,_void,_void>::operator()
                    ((member_function_pointer<long,_void,_void,_void> *)in_stack_fffffffffffffd40,
                     (long)in_stack_fffffffffffffd38);
        }
      }
      else {
        member_function_pointer<void,_void,_void,_void>::operator()
                  ((member_function_pointer<void,_void,_void,_void> *)0x29d2ab);
      }
    }
    else {
      bound_function_pointer::operator()((bound_function_pointer *)0x29d046);
    }
    auto_mutex::auto_mutex
              ((auto_mutex *)in_stack_fffffffffffffd40,(mutex *)in_stack_fffffffffffffd38);
    ptVar2 = array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
             ::operator[](in_RDI,local_1e0);
    ptVar2->is_being_processed = false;
    ptVar3 = array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
             ::operator[](in_RDI,local_1e0);
    ptVar3->task_id = 0;
    array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::operator[](in_RDI,local_1e0);
    bound_function_pointer::clear(in_stack_fffffffffffffde0);
    array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::operator[](in_RDI,local_1e0);
    mfp_kernel_1_base_class<0UL>::clear((mfp_kernel_1_base_class<0UL> *)ptVar2);
    array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::operator[](in_RDI,local_1e0);
    mfp_kernel_1_base_class<1UL>::clear((mfp_kernel_1_base_class<1UL> *)ptVar2);
    array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
    ::operator[](in_RDI,local_1e0);
    mfp_kernel_1_base_class<2UL>::clear((mfp_kernel_1_base_class<2UL> *)ptVar2);
    ptVar2 = array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
             ::operator[](in_RDI,local_1e0);
    ptVar2->arg1 = 0;
    ptVar2 = array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
             ::operator[](in_RDI,local_1e0);
    ptVar2->arg2 = 0;
    ptVar2 = array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
             ::operator[](in_RDI,local_1e0);
    std::__exception_ptr::exception_ptr::operator=
              ((exception_ptr *)ptVar2,(exception_ptr *)in_stack_fffffffffffffd48);
    signaler::broadcast((signaler *)0x29d25e);
    auto_mutex::~auto_mutex((auto_mutex *)0x29d26d);
    std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)in_stack_fffffffffffffd40);
  }
  task_state_type::~task_state_type(in_stack_fffffffffffffd40);
  return;
}

Assistant:

void thread_pool_implementation::
    thread (
    )
    {
        {
            // save the id of this worker thread into worker_thread_ids
            auto_mutex M(m);
            thread_id_type id = get_thread_id();
            worker_thread_ids.push_back(id);
        }

        task_state_type task;
        while (we_are_destructing == false)
        {
            long idx = 0;

            // wait for a task to do 
            { auto_mutex M(m);
                while ( (idx = find_ready_task()) == -1 && we_are_destructing == false)
                    task_ready_signaler.wait();

                if (we_are_destructing)
                    break;

                tasks[idx].is_being_processed = true;
                task = tasks[idx];
            }

            std::exception_ptr eptr = nullptr;
            try
            {
                // now do the task
                if (task.bfp)
                    task.bfp();
                else if (task.mfp0)
                    task.mfp0();
                else if (task.mfp1)
                    task.mfp1(task.arg1);
                else if (task.mfp2)
                    task.mfp2(task.arg1, task.arg2);
            }
            catch(...)
            {
                eptr = std::current_exception();
            }

            // Now let others know that we finished the task.  We do this
            // by clearing out the state of this task
            { auto_mutex M(m);
                tasks[idx].is_being_processed = false;
                tasks[idx].task_id = 0;
                tasks[idx].bfp.clear();
                tasks[idx].mfp0.clear();
                tasks[idx].mfp1.clear();
                tasks[idx].mfp2.clear();
                tasks[idx].arg1 = 0;
                tasks[idx].arg2 = 0;
                tasks[idx].eptr = eptr;
                task_done_signaler.broadcast();
            }

        }
    }